

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O2

void ymf262_reset_chip(void *chip)

{
  long lVar1;
  uint uVar2;
  
  *(undefined8 *)((long)chip + 0x12c0) = 0;
  *(undefined4 *)((long)chip + 0x22ec) = 1;
  *(undefined1 *)((long)chip + 0x230e) = 0;
  OPL3_STATUS_RESET((OPL3 *)chip,0x60);
  *(undefined8 *)((long)chip + 0x22fc) = 0x100000000400;
  OPL3WriteReg((OPL3 *)chip,4,0);
  for (uVar2 = 0xff; 0x1f < uVar2; uVar2 = uVar2 - 1) {
    OPL3WriteReg((OPL3 *)chip,uVar2,0);
  }
  for (uVar2 = 0x1ff; 0x11f < uVar2; uVar2 = uVar2 - 1) {
    OPL3WriteReg((OPL3 *)chip,uVar2,0);
  }
  for (lVar1 = 0xcc; lVar1 != 0x11ac; lVar1 = lVar1 + 0xf0) {
    *(undefined1 *)((long)chip + lVar1 + -0x7a) = 0;
    *(undefined4 *)((long)chip + lVar1 + -0x70) = 0x1ff;
    *(undefined1 *)((long)chip + lVar1 + -10) = 0;
    *(undefined4 *)((long)chip + lVar1) = 0x1ff;
  }
  *(undefined1 *)((long)chip + 0x2340) = 1;
  return;
}

Assistant:

void ymf262_reset_chip(void *chip)
{
	OPL3ResetChip((OPL3 *)chip);
}